

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learn.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  double dVar1;
  char *__s1;
  char *data_file_00;
  bool bVar2;
  int iVar3;
  clock_t cVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  FILE *pFVar8;
  reference pvVar9;
  clock_t cVar10;
  double end_time;
  int j_7;
  int j_6;
  int j_5;
  int pred_y_1;
  int true_y_1;
  int i_3;
  FILE *f;
  int total_wrong_1;
  int total_case_1;
  int i_2;
  FILE *flog;
  int local_60;
  int j_4;
  int j_3;
  int j_2;
  int pred_y;
  int true_y;
  int i_1;
  int total_wrong;
  int total_case;
  int j_1;
  int j;
  int i;
  int epoch;
  bool first;
  double start_time;
  char *data_file;
  char *operation;
  char **argv_local;
  int argc_local;
  
  __s1 = argv[1];
  ts_len = atoi(argv[2]);
  data_file_00 = argv[3];
  data_n = atoi(argv[4]);
  alpha = atof(argv[5]);
  readfile(data_file_00);
  cVar4 = clock();
  iVar3 = strcmp(__s1,"train");
  if (iVar3 == 0) {
    regularization = atof(argv[6]);
    max_iter = atoi(argv[7]);
    learn_rate = atof(argv[8]);
    if (argc == 0xb) {
      test_n = atoi(argv[10]);
      readtestfile(argv[9]);
    }
    init((EVP_PKEY_CTX *)0x0);
    bVar2 = true;
    for (j = 0; j < max_iter; j = j + 1) {
      if (j % 100 == 0) {
        printf("epoch %d\n",(ulong)(uint)j);
      }
      for (j_1 = 0; j_1 < data_n; j_1 = j_1 + 1) {
        if (bVar2) {
          printf("data format:\n");
          printf("data:\n");
          for (total_case = 0; total_case < ts_len; total_case = total_case + 1) {
            pvVar5 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](&data_x,(long)j_1);
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                               (pvVar5,(long)total_case);
            printf("%9.6f",*pvVar6);
          }
          printf("\n");
          printf("label:\n");
          for (total_wrong = 0; total_wrong < num_c; total_wrong = total_wrong + 1) {
            pvVar5 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](&data_y,(long)j_1);
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                               (pvVar5,(long)total_wrong);
            printf("%9.0f",*pvVar6);
          }
          printf("\n");
          bVar2 = false;
        }
        pvVar5 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&data_x,(long)j_1);
        pvVar7 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&data_y,(long)j_1);
        train(pvVar5,pvVar7,regularization);
      }
      std::vector<int,_std::allocator<int>_>::push_back(&rightlog,&right_cnt);
      iVar3 = test_n;
      right_cnt = 0;
      if ((argc == 0xb) && (j % 100 == 0)) {
        true_y = 0;
        for (pred_y = 0; pred_y < test_n; pred_y = pred_y + 1) {
          j_3 = 0;
          for (j_4 = 0; j_4 < num_c; j_4 = j_4 + 1) {
            pvVar5 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](&test_y,(long)pred_y);
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)j_4);
            if (0.0 < *pvVar6) {
              j_2 = j_4;
            }
            pvVar5 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](&test_y,(long)pred_y);
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)j_4);
            *pvVar6 = 0.0;
          }
          pvVar5 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&test_x,(long)pred_y);
          pvVar7 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&test_y,(long)pred_y);
          predict(pvVar5,pvVar7);
          for (local_60 = 1; local_60 < num_c; local_60 = local_60 + 1) {
            pvVar5 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](&test_y,(long)pred_y);
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_60)
            ;
            dVar1 = *pvVar6;
            pvVar5 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](&test_y,(long)pred_y);
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)j_3);
            if (*pvVar6 <= dVar1 && dVar1 != *pvVar6) {
              j_3 = local_60;
            }
          }
          if (j_2 != j_3) {
            true_y = true_y + 1;
          }
          for (flog._4_4_ = 0; flog._4_4_ < num_c; flog._4_4_ = flog._4_4_ + 1) {
            pvVar5 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](&test_y,(long)pred_y);
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                               (pvVar5,(long)flog._4_4_);
            *pvVar6 = 0.0;
            if (flog._4_4_ == j_2) {
              pvVar5 = std::
                       vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ::operator[](&test_y,(long)pred_y);
              pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (pvVar5,(long)flog._4_4_);
              *pvVar6 = 1.0;
            }
          }
        }
        printf("Accuracy = %8.3f Correct = %5d , Wrong = %5d\n",
               ((double)(iVar3 - true_y) * 100.0) / (double)iVar3,(ulong)(uint)(iVar3 - true_y),
               (ulong)(uint)true_y);
      }
    }
    pFVar8 = fopen("rightlog","w");
    for (total_wrong_1 = 0; total_wrong_1 < max_iter; total_wrong_1 = total_wrong_1 + 1) {
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&rightlog,(long)total_wrong_1);
      fprintf(pFVar8,"epoch %d accuracy %f\n",((double)*pvVar9 * 1.0) / (double)data_n,
              (ulong)(total_wrong_1 + 1));
    }
    fclose(pFVar8);
    save();
  }
  else {
    iVar3 = strcmp(__s1,"test");
    if (iVar3 == 0) {
      init((EVP_PKEY_CTX *)0x1);
      iVar3 = data_n;
      f._4_4_ = 0;
      pFVar8 = fopen("result.txt","a");
      for (pred_y_1 = 0; pred_y_1 < data_n; pred_y_1 = pred_y_1 + 1) {
        j_6 = 0;
        for (j_7 = 0; j_7 < num_c; j_7 = j_7 + 1) {
          pvVar5 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&data_y,(long)pred_y_1);
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)j_7);
          if (0.0 < *pvVar6) {
            j_5 = j_7;
          }
          pvVar5 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&data_y,(long)pred_y_1);
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)j_7);
          *pvVar6 = 0.0;
        }
        pvVar5 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&data_x,(long)pred_y_1);
        pvVar7 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&data_y,(long)pred_y_1);
        predict(pvVar5,pvVar7);
        for (end_time._4_4_ = 1; end_time._4_4_ < num_c; end_time._4_4_ = end_time._4_4_ + 1) {
          pvVar5 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&data_y,(long)pred_y_1);
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             (pvVar5,(long)end_time._4_4_);
          dVar1 = *pvVar6;
          pvVar5 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&data_y,(long)pred_y_1);
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)j_6);
          if (*pvVar6 <= dVar1 && dVar1 != *pvVar6) {
            j_6 = end_time._4_4_;
          }
        }
        if (j_5 != j_6) {
          f._4_4_ = f._4_4_ + 1;
          fprintf(pFVar8,"%d case true label %d predict label %d\n",(ulong)(pred_y_1 + 1),
                  (ulong)(uint)j_5,(ulong)(uint)j_6);
          for (end_time._0_4_ = 0; end_time._0_4_ < num_c; end_time._0_4_ = end_time._0_4_ + 1) {
            pvVar5 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](&data_y,(long)pred_y_1);
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                               (pvVar5,(long)end_time._0_4_);
            fprintf(pFVar8,"%9.6f",*pvVar6);
            if (end_time._0_4_ == num_c + -1) {
              fprintf(pFVar8,"\n");
            }
            else {
              fprintf(pFVar8,",");
            }
          }
        }
      }
      fprintf(pFVar8,"Accuracy = %8.3f Correct = %5d , Wrong = %5d\n",
              ((double)(int)(iVar3 - f._4_4_) * 100.0) / (double)iVar3,(ulong)(iVar3 - f._4_4_),
              (ulong)f._4_4_);
      fclose(pFVar8);
    }
    else {
      printf("wrong operation !\n");
    }
  }
  cVar10 = clock();
  printf("Total Running Time = %.3f sec\n",((double)cVar10 - (double)cVar4) / 1000000.0);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {

    /**
     * arguments:
     * 1.train ts_len data_file data_n alpha regular max_iter learn_rate [test_data_file test_n]
     * 2.test ts_len data_file data_n alpha
     */
    char *operation = argv[1];
    ts_len = atoi(argv[2]);

    char *data_file = argv[3];
    data_n = atoi(argv[4]);

    alpha = atof(argv[5]);

    readfile(data_file);

    double start_time = clock();

    if (strcmp(operation, "train") == 0) {

        regularization = atof(argv[6]);
        max_iter = atoi(argv[7]);
        learn_rate = atof(argv[8]);

        if (argc == 11) {
            test_n = atoi(argv[10]);
            readtestfile(argv[9]);
        }

        init(0);

        // training
        bool first = true;
        for (int epoch = 0; epoch < max_iter; ++epoch) {
            if (epoch % 100 == 0)
                printf("epoch %d\n", epoch);
            for (int i = 0; i < data_n; ++i) {
                if (first) {
                    printf("data format:\n");
                    printf("data:\n");
                    for (int j = 0; j < ts_len; ++j) {
                        printf("%9.6f", data_x[i][j]);
                    }
                    printf("\n");
                    printf("label:\n");
                    for (int j = 0; j < num_c; ++j) {
                        printf("%9.0f", data_y[i][j]);
                    }
                    printf("\n");
                    first = false;
                }
                train(data_x[i], data_y[i], regularization);
            }

            if (PRINT_LOG) {
                rightlog.push_back(right_cnt);
//                printf("epoch %d accuracy %f\n", epoch, 1.0 * right_cnt / data_n);
                right_cnt = 0;

                if (argc == 11 && epoch % 100 == 0) {
                    int total_case = test_n;
                    int total_wrong = 0;

                    //testing
                    for (int i = 0; i < test_n; ++i) {

                        int true_y, pred_y = 0;
                        for (int j = 0; j < num_c; j++) {
                            if (test_y[i][j] > 0) {
                                true_y = j;
                            }
                            test_y[i][j] = 0; // clear y
                        }

                        predict(test_x[i], test_y[i]);

                        // find the max(y) and its index is the label of the case
                        for (int j = 1; j < num_c; j++) {
                            if (test_y[i][j] > test_y[i][pred_y]) {
                                pred_y = j;
                            }
                        }

                        if (true_y != pred_y) {
                            ++total_wrong;
                        }

                        // reset y
                        for (int j = 0; j < num_c; j++) {
                            test_y[i][j] = 0.0;
                            if (j == true_y) {
                                test_y[i][j] = 1.0;
                            }
                        }

                    }

                    printf("Accuracy = %8.3f Correct = %5d , Wrong = %5d\n",
                           100.0 * (total_case - total_wrong) / total_case, total_case - total_wrong, total_wrong);
                }

            }

        }

        if (PRINT_LOG) {
            FILE *flog;
            flog = fopen("rightlog", "w");
            for (int i = 0; i < max_iter; ++i) {
                fprintf(flog, "epoch %d accuracy %f\n", i + 1, 1.0 * rightlog[i] / data_n);
            }
            fclose(flog);
        }

        // output w, w0 and shapelet
        save();

    } else if (strcmp(operation, "test") == 0) {

        // input w, w0 and shapelet
        init(1);

        int total_case = data_n;
        int total_wrong = 0;
        FILE *f = fopen("result.txt", "a");

        //testing
        for (int i = 0; i < data_n; ++i) {

            int true_y, pred_y = 0;
            for (int j = 0; j < num_c; j++) {
                if (data_y[i][j] > 0) {
                    true_y = j;
                }
                data_y[i][j] = 0; // clear y
            }

            predict(data_x[i], data_y[i]);
            // find the max(y) and its index is the label of the case
            for (int j = 1; j < num_c; j++) {
                if (data_y[i][j] > data_y[i][pred_y]) {
                    pred_y = j;
                }
            }

            // a wrong case found
            if (true_y != pred_y) {
                ++total_wrong;
                fprintf(f, "%d case true label %d predict label %d\n", i + 1, true_y, pred_y);
                for (int j = 0; j < num_c; ++j) {
                    fprintf(f, "%9.6f", data_y[i][j]);
                    if (j != num_c - 1) {
                        fprintf(f, ",");
                    } else {
                        fprintf(f, "\n");
                    }
                }
            }

        }

        fprintf(f, "Accuracy = %8.3f Correct = %5d , Wrong = %5d\n", 100.0 * (total_case - total_wrong) / total_case,
                total_case - total_wrong, total_wrong);
        fclose(f);

    } else {
        printf("wrong operation !\n");
    }

    double end_time = clock();
    printf("Total Running Time = %.3f sec\n", (end_time - start_time) / CLOCKS_PER_SEC);

    return 0;
}